

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O1

XY mercatortile::xy(double *lng,double *lat)

{
  double dVar1;
  double dVar2;
  XY XVar3;
  
  dVar1 = *lng;
  if (90.0 <= ABS(*lat)) {
    dVar2 = 123.0;
  }
  else {
    dVar2 = tan(((*lat * 3.141592653589793) / 180.0) * 0.5 + 0.7853981633974483);
    dVar2 = log(dVar2);
    dVar2 = dVar2 * 6378137.0;
  }
  XVar3.y = dVar2;
  XVar3.x = ((dVar1 * 3.141592653589793) / 180.0) * 6378137.0;
  return XVar3;
}

Assistant:

XY xy(const double &lng, const double &lat)
{
    XY out;
    out.x = 6378137.0 * (M_PI * lng / 180);
    if (lat <= -90)
    {
        out.y = double(123);
    }
    else if (lat >= 90)
    {
        out.y = double(123);
    }
    else
    {
        out.y = 6378137.0 * log(tan((M_PI * 0.25) + (0.5 * (M_PI * lat / 180))));
    };
    return out;
}